

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::flushFPinfo(FabArrayBase *this,bool no_assertion)

{
  bool bVar1;
  pointer ppVar2;
  iterator __position;
  byte in_SIL;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar4;
  iterator End;
  iterator it_1;
  FPinfoCacheIter oit;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  o_er_it;
  BDKey *otherkey;
  BDKey *dstkey;
  BDKey *srckey;
  FPinfoCacheIter it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  er_it;
  vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
  others;
  key_type *in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  BDKey *in_stack_fffffffffffffef8;
  const_iterator in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  BDKey *local_e0;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>_>
  local_a8;
  _Base_ptr local_a0;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_98;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_90;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_88;
  _Base_ptr local_80;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_78;
  BDKey *local_70;
  BDKey *local_68;
  BDKey *local_60;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_58 [3];
  iterator local_40;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  local_38 [4];
  byte local_11 [9];
  byte *local_8;
  
  local_11[0] = in_SIL & 1;
  local_8 = local_11;
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
  ::vector((vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
            *)0x12ad4f5);
  pVar3 = std::
          multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
          ::equal_range((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                         *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8);
  local_40._M_node = (_Base_ptr)pVar3.first._M_node;
  while( true ) {
    local_38[0] = pVar3.second._M_node;
    local_58[0] = pVar3.first._M_node;
    bVar1 = std::operator!=(local_58,local_38);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                           *)0x12ad572);
    local_60 = &ppVar2->second->m_srcbdk;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                           *)0x12ad591);
    local_68 = &ppVar2->second->m_dstbdk;
    bVar1 = BDKey::operator!=((BDKey *)in_stack_ffffffffffffff00._M_node,in_stack_fffffffffffffef8);
    if (bVar1) {
      bVar1 = BDKey::operator==((BDKey *)in_stack_ffffffffffffff00._M_node,in_stack_fffffffffffffef8
                               );
      if (bVar1) {
        local_e0 = local_68;
      }
      else {
        local_e0 = local_60;
      }
      local_70 = local_e0;
      pVar4 = std::
              multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
              ::equal_range((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                             *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffee8);
      local_80 = (_Base_ptr)pVar4.first._M_node;
      while( true ) {
        local_78 = pVar4.second._M_node;
        local_88 = pVar4.first._M_node;
        bVar1 = std::operator!=(&local_88,&local_78);
        if (!bVar1) break;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                               *)0x12ad682);
        in_stack_ffffffffffffff08._M_node = (_Base_ptr)ppVar2->second;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                               *)0x12ad698);
        if ((FPinfo *)in_stack_ffffffffffffff08._M_node == ppVar2->second) {
          std::
          vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
          ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
                       *)in_stack_ffffffffffffff00._M_node,(value_type *)in_stack_fffffffffffffef8);
        }
        std::
        _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                      *)in_stack_fffffffffffffef0._M_node);
        pVar4.second._M_node = local_78._M_node;
        pVar4.first._M_node = local_88._M_node;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>::
    operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                *)0x12ad708);
    CacheStats::recordErase
              ((CacheStats *)in_stack_ffffffffffffff00._M_node,(Long)in_stack_fffffffffffffef8);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                           *)0x12ad72c);
    in_stack_ffffffffffffff00._M_node = (_Base_ptr)ppVar2->second;
    if ((FPinfo *)in_stack_ffffffffffffff00._M_node != (FPinfo *)0x0) {
      FPinfo::~FPinfo((FPinfo *)in_stack_fffffffffffffef0._M_node);
      operator_delete(in_stack_ffffffffffffff00._M_node,0x148);
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
                *)in_stack_fffffffffffffef0._M_node);
    pVar3.second._M_node = local_38[0]._M_node;
    pVar3.first._M_node = local_58[0]._M_node;
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  ::_Rb_tree_const_iterator(&local_90,&local_40);
  std::
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  ::_Rb_tree_const_iterator(&local_98,local_38);
  __position = std::
               multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
               ::erase((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                        *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff08,
                       in_stack_ffffffffffffff00);
  local_a0 = __position._M_node;
  local_a8._M_current =
       (_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
        *)std::
          vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
          ::begin((vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
                   *)in_stack_fffffffffffffee8);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
  ::end((vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
         *)in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>_>
                             *)in_stack_fffffffffffffef0._M_node,
                            (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>_>
    ::operator*(&local_a8);
    in_stack_fffffffffffffef0 =
         std::
         multimap<amrex::FabArrayBase::BDKey,amrex::FabArrayBase::FPinfo*,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
         ::erase_abi_cxx11_(in_stack_fffffffffffffef0._M_node,__position);
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>_>
    ::operator++(&local_a8);
  }
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
  ::~vector((vector<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>_>
             *)in_stack_ffffffffffffff00._M_node);
  return;
}

Assistant:

void
FabArrayBase::flushFPinfo (bool no_assertion)
{
    amrex::ignore_unused(no_assertion);
    BL_ASSERT(no_assertion || getBDKey() == m_bdkey);

    std::vector<FPinfoCacheIter> others;

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(m_bdkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        const BDKey& srckey = it->second->m_srcbdk;
        const BDKey& dstkey = it->second->m_dstbdk;

        BL_ASSERT((srckey==dstkey && srckey==m_bdkey) ||
                  (m_bdkey==srckey) || (m_bdkey==dstkey));

        if (srckey != dstkey) {
            const BDKey& otherkey = (m_bdkey == srckey) ? dstkey : srckey;
            std::pair<FPinfoCacheIter,FPinfoCacheIter> o_er_it = m_TheFillPatchCache.equal_range(otherkey);

            for (FPinfoCacheIter oit = o_er_it.first; oit != o_er_it.second; ++oit)
            {
                if (it->second == oit->second)
                    others.push_back(oit);
            }
        }

#ifdef AMREX_MEM_PROFILING
        m_FPinfo_stats.bytes -= it->second->bytes();
#endif
        m_FPinfo_stats.recordErase(it->second->m_nuse);
        delete it->second;
    }

    m_TheFillPatchCache.erase(er_it.first, er_it.second);

    for (std::vector<FPinfoCacheIter>::iterator it = others.begin(),
             End = others.end(); it != End; ++it)
    {
        m_TheFillPatchCache.erase(*it);
    }
}